

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

void __thiscall
CVmObjFileName::restore_from_file
          (CVmObjFileName *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  CVmVarHeap *pCVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  char *pcVar9;
  CVmObjFileName *in_RDI;
  size_t len;
  err_frame_t err_cur__;
  char *lcl;
  char *uni;
  int ok;
  char sfbuf [4096];
  vm_filnam_ext *ext;
  int32_t sfid;
  CVmFile *in_stack_ffffffffffffeea0;
  undefined8 uVar10;
  char *in_stack_ffffffffffffeea8;
  undefined4 in_stack_ffffffffffffeeb0;
  undefined4 in_stack_ffffffffffffeeb4;
  undefined8 in_stack_ffffffffffffeeb8;
  int32_t iVar11;
  uint local_1130 [2];
  undefined8 local_1128;
  void *local_1120;
  __jmp_buf_tag _Stack_1118;
  undefined4 in_stack_ffffffffffffefc0;
  char cVar12;
  undefined4 in_stack_ffffffffffffefc4;
  char local_1038 [3812];
  int32_t in_stack_fffffffffffffeac;
  size_t in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  vm_filnam_ext *local_30;
  
  iVar11 = (int32_t)((ulong)in_stack_ffffffffffffeeb8 >> 0x20);
  if ((in_RDI->super_CVmObject).ext_ != (char *)0x0) {
    pCVar5 = CVmMemory::get_var_heap(G_mem_X);
    (*pCVar5->_vptr_CVmVarHeap[6])(pCVar5,(in_RDI->super_CVmObject).ext_);
  }
  lVar6 = CVmFile::read_int4(in_stack_ffffffffffffeea0);
  iVar2 = (int)lVar6;
  if (iVar2 == 0) {
    iVar2 = 0;
    puVar7 = (undefined8 *)_ZTW11G_err_frame();
    local_1128 = *puVar7;
    plVar8 = (long *)_ZTW11G_err_frame();
    *plVar8 = (long)local_1130;
    local_1130[0] = _setjmp(&_Stack_1118);
    if (local_1130[0] == 0) {
      uVar4 = CVmFile::read_uint2(in_stack_ffffffffffffeea0);
      pcVar9 = lib_alloc_str((size_t)in_stack_ffffffffffffeea0);
      CVmFile::read_bytes((CVmFile *)CONCAT44(in_stack_ffffffffffffeeb4,in_stack_ffffffffffffeeb0),
                          in_stack_ffffffffffffeea8,(size_t)in_stack_ffffffffffffeea0);
      pcVar9[uVar4] = '\0';
      pcVar9 = url_to_local((char *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                            (size_t)pcVar9,iVar2);
      strlen(pcVar9);
      local_30 = vm_filnam_ext::alloc_ext
                           (in_RDI,iVar11,
                            (char *)CONCAT44(in_stack_ffffffffffffeeb4,in_stack_ffffffffffffeeb0),
                            (size_t)pcVar9);
    }
    if ((local_1130[0] & 0x8000) == 0) {
      local_1130[0] = local_1130[0] | 0x8000;
      lib_free_str((char *)0x2ea494);
      lib_free_str((char *)0x2ea4a1);
    }
    uVar10 = local_1128;
    puVar7 = (undefined8 *)_ZTW11G_err_frame();
    *puVar7 = uVar10;
    if ((local_1130[0] & 0x4001) != 0) {
      puVar7 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar7 & 2) != 0) {
        plVar8 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar8 + 0x10));
      }
      pvVar1 = local_1120;
      plVar8 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar8 + 0x10) = pvVar1;
      err_rethrow();
    }
    if ((local_1130[0] & 2) != 0) {
      free(local_1120);
    }
  }
  else {
    iVar3 = CVmObjFile::sfid_to_path
                      (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac
                      );
    cVar12 = (char)iVar3;
    iVar11 = (int32_t)((ulong)local_1038 >> 0x20);
    strlen(local_1038);
    local_30 = vm_filnam_ext::alloc_ext
                         (in_RDI,iVar11,(char *)CONCAT44(iVar2,in_stack_ffffffffffffeeb0),
                          (size_t)in_stack_ffffffffffffeea8);
    local_30->sfid_valid = cVar12;
  }
  (in_RDI->super_CVmObject).ext_ = (char *)local_30;
  return;
}

Assistant:

void CVmObjFileName::restore_from_file(VMG_ vm_obj_id_t self,
                                       CVmFile *fp, CVmObjFixup *fixups)
{
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the special file ID */
    int32_t sfid = fp->read_int4();

    /* if there's a special file ID, look it up; otherwise read the name */
    vm_filnam_ext *ext;
    if (sfid != 0)
    {
        /* get the special file path */
        char sfbuf[OSFNMAX];
        int ok = CVmObjFile::sfid_to_path(vmg_ sfbuf, sizeof(sfbuf), sfid);

        /* create the extension */
        ext = vm_filnam_ext::alloc_ext(vmg_ this, sfid, sfbuf, strlen(sfbuf));

        /* note whether the ID is valid on this platform */
        ext->sfid_valid = (char)ok;
    }
    else
    {
        char *uni = 0, *lcl = 0;
        err_try
        {
            /* read the filename length */
            size_t len = fp->read_uint2();
            
            /* load the saved universal path */
            uni = lib_alloc_str(len + 1);
            fp->read_bytes(uni, len);
            uni[len] = '\0';
            
            /* convert the saved universal path to local notation */
            lcl = url_to_local(vmg_ uni, len, TRUE);
        
            /* allocate the extension structure */
            ext = vm_filnam_ext::alloc_ext(vmg_ this, 0, lcl, strlen(lcl));
        }
        err_finally
        {
            /* we're done with the allocated buffers */
            lib_free_str(lcl);
            lib_free_str(uni);
        }